

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::get
          (RaceSuccessfulPromiseNodeBase *this,ExceptionOrValue *output)

{
  if ((this->output->exception).ptr.isSet == true) {
    if ((output->exception).ptr.isSet == false) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(this->output->exception).ptr.field_1.value
                );
      (output->exception).ptr.isSet = true;
    }
    return;
  }
  (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])(this,output);
  return;
}

Assistant:

void RaceSuccessfulPromiseNodeBase::get(ExceptionOrValue &output) noexcept {
  KJ_IF_SOME(exception, this->output.exception) {
    output.addException(kj::mv(exception));
  } else {
    getNoError(output);
  }
}